

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::IsWritable
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = this->propertyCount;
  bVar2 = 0 < iVar1;
  if (0 < iVar1) {
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      uVar3 = 1;
      do {
        uVar4 = uVar3 & 0xffff;
        bVar2 = (int)uVar4 < iVar1;
        if (iVar1 <= (int)uVar4) break;
        uVar3 = uVar4 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar4 << 4)) + 8) !=
               propertyId);
      goto LAB_00e4ff4f;
    }
    bVar2 = true;
  }
  uVar4 = 0;
LAB_00e4ff4f:
  uVar3 = 1;
  if (bVar2) {
    uVar3 = *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar4 << 4)) & 4;
  }
  return uVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::IsWritable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            return true;
        }
        return descriptors[index].Attributes & PropertyWritable;
    }